

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void dbuf_put_leb128(DynBuf *s,uint32_t v)

{
  uint uVar1;
  uint in_ESI;
  uint32_t a;
  uint8_t in_stack_ffffffffffffffef;
  
  while( true ) {
    uVar1 = in_ESI >> 7;
    if (uVar1 == 0) break;
    dbuf_putc((DynBuf *)(CONCAT44(uVar1,in_ESI) & 0xffffffff0000007f),in_stack_ffffffffffffffef);
    in_ESI = uVar1;
  }
  dbuf_putc((DynBuf *)((ulong)in_ESI & 0xffffffff0000007f),in_stack_ffffffffffffffef);
  return;
}

Assistant:

static void dbuf_put_leb128(DynBuf *s, uint32_t v)
{
    uint32_t a;
    for(;;) {
        a = v & 0x7f;
        v >>= 7;
        if (v != 0) {
            dbuf_putc(s, a | 0x80);
        } else {
            dbuf_putc(s, a);
            break;
        }
    }
}